

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O2

void ngai_acc_common(Integer g_a,Integer *lo,Integer *hi,void *buf,Integer *ld,void *alpha,
                    Integer *nbhandle)

{
  short sVar1;
  int iVar2;
  uint uVar3;
  int optype;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  armci_hdl_t *nb_handle;
  int iVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  void *src_ptr;
  Integer *nbhandle_00;
  ulong uVar11;
  int proc;
  ulong local_440;
  void *local_438;
  ulong local_430;
  Integer *phi;
  Integer *plo;
  double local_418;
  long local_410;
  void *local_408;
  char *local_400;
  long local_3f8;
  char *prem;
  int count [7];
  int stride_loc [7];
  int stride_rem [7];
  Integer ga_nbhandle;
  Integer ldrem [7];
  _iterator_hdl it_hdl;
  
  lVar8 = g_a + 1000;
  local_438 = alpha;
  local_408 = buf;
  if ((g_a < -1000) || (_max_global_array <= lVar8)) {
    sprintf((char *)&it_hdl,"%s: INVALID ARRAY HANDLE","ngai_acc_common");
    pnga_error((char *)&it_hdl,g_a);
  }
  if (GA[lVar8].actv == 0) {
    sprintf((char *)&it_hdl,"%s: ARRAY NOT ACTIVE","ngai_acc_common");
    pnga_error((char *)&it_hdl,g_a);
  }
  iVar2 = GA[lVar8].elemsize;
  sVar1 = GA[lVar8].ndim;
  uVar3 = GA[lVar8].type - 0x3e9;
  if ((uVar3 < 7) && ((0x6fU >> (uVar3 & 0x1f) & 1) != 0)) {
    optype = *(int *)(&DAT_001b220c + (ulong)uVar3 * 4);
  }
  else {
    pnga_error("type not supported",(long)GA[lVar8].type);
    optype = -1;
  }
  local_410 = (long)iVar2;
  gai_iterator_init(g_a,lo,hi,&it_hdl);
  uVar6 = 0;
  uVar9 = 0;
  if (0 < sVar1) {
    uVar9 = (ulong)(uint)(int)sVar1;
  }
  lVar8 = 1;
  for (; uVar9 != uVar6; uVar6 = uVar6 + 1) {
    lVar8 = lVar8 * ((hi[uVar6] - lo[uVar6]) + 1);
  }
  local_418 = (double)iVar2;
  GAbytes.acctot = (double)lVar8 * local_418 + GAbytes.acctot;
  GAstat.numacc = GAstat.numacc + 1;
  nbhandle_00 = &ga_nbhandle;
  if (nbhandle != (Integer *)0x0) {
    nbhandle_00 = nbhandle;
  }
  ga_init_nbhandle(nbhandle_00);
  uVar3 = (int)sVar1 - 1;
  local_440 = (ulong)uVar3;
  uVar6 = 0;
  uVar11 = 0;
  if (0 < (int)uVar3) {
    uVar11 = (ulong)uVar3;
  }
  for (; (int)uVar6 != 2; uVar6 = (ulong)((int)uVar6 + 1)) {
    gai_iterator_reset(&it_hdl);
    local_430 = uVar6;
    while( true ) {
      iVar4 = gai_iterator_next(&it_hdl,&proc,&plo,&phi,&prem,ldrem);
      if (iVar4 == 0) break;
      uVar5 = armci_domain_same_id(0,proc);
      uVar3 = (uint)(uVar5 == 0);
      if ((int)uVar6 != 0) {
        uVar3 = uVar5;
      }
      if (uVar3 != 0) {
        lVar10 = *plo - *lo;
        lVar8 = 1;
        for (uVar6 = 0; uVar11 != uVar6; uVar6 = uVar6 + 1) {
          lVar8 = lVar8 * ld[uVar6];
          lVar10 = lVar10 + (plo[uVar6 + 1] - lo[uVar6 + 1]) * lVar8;
        }
        for (uVar6 = 0; uVar9 != uVar6; uVar6 = uVar6 + 1) {
          count[uVar6] = ((int)phi[uVar6] - (int)plo[uVar6]) + 1;
        }
        count[0] = count[0] * iVar2;
        iVar4 = iVar2;
        iVar7 = iVar2;
        stride_loc[0] = iVar2;
        stride_rem[0] = iVar2;
        for (lVar8 = 0; uVar11 * 4 - lVar8 != 0; lVar8 = lVar8 + 4) {
          iVar4 = iVar4 * *(int *)((long)ldrem + lVar8 * 2);
          *(int *)((long)stride_rem + lVar8) = iVar4;
          iVar7 = iVar7 * *(int *)((long)ld + lVar8 * 2);
          *(int *)((long)stride_loc + lVar8) = iVar7;
          *(int *)((long)stride_rem + lVar8 + 4) = iVar4;
          *(int *)((long)stride_loc + lVar8 + 4) = iVar7;
        }
        if (GA_fence_set != 0) {
          fence_array[proc] = '\x01';
        }
        if (GAme == proc) {
          lVar8 = 1;
          for (uVar6 = 0; uVar9 != uVar6; uVar6 = uVar6 + 1) {
            lVar8 = lVar8 * ((phi[uVar6] - plo[uVar6]) + 1);
          }
          GAbytes.accloc = (double)lVar8 * local_418 + GAbytes.accloc;
        }
        src_ptr = (void *)(lVar10 * local_410 + (long)local_408);
        if (nbhandle == (Integer *)0x0) {
          ARMCI_AccS(optype,local_438,src_ptr,stride_loc,prem,stride_rem,count,(int)local_440,proc);
          uVar6 = local_430;
        }
        else {
          local_400 = prem;
          local_3f8 = (long)proc;
          nb_handle = get_armci_nbhandle(nbhandle);
          ARMCI_NbAccS(optype,local_438,src_ptr,stride_loc,local_400,stride_rem,count,(int)local_440
                       ,(int)local_3f8,nb_handle);
          uVar6 = local_430;
        }
      }
    }
  }
  gai_iterator_destroy(&it_hdl);
  return;
}

Assistant:

void ngai_acc_common(Integer g_a,
                   Integer *lo,
                   Integer *hi,
                   void    *buf,
                   Integer *ld,
                   void    *alpha,
                   Integer *nbhandle)
{
  Integer  p, np=0, handle=GA_OFFSET + g_a;
  Integer  idx, elems, size, type, p_handle, ga_nbhandle;
  int optype=-1, loop, ndim, cond;
  int proc;
  int num_loops=2; /* 1st loop for remote procs; 2nd loop for local procs */
  Integer n_rstrctd;
  Integer *rank_rstrctd;
  _iterator_hdl it_hdl;

  GA_Internal_Threadsafe_Lock();

  ga_check_handleM(g_a, "ngai_acc_common");

  size = GA[handle].elemsize;
  type = GA[handle].type;
  ndim = GA[handle].ndim;
  p_handle = GA[handle].p_handle;
  n_rstrctd = (Integer)GA[handle].num_rstrctd;
  rank_rstrctd = GA[handle].rank_rstrctd;

  if(type==C_DBL) optype= ARMCI_ACC_DBL;
  else if(type==C_FLOAT) optype= ARMCI_ACC_FLT;
  else if(type==C_DCPL)optype= ARMCI_ACC_DCP;
  else if(type==C_SCPL)optype= ARMCI_ACC_CPL;
  else if(type==C_INT)optype= ARMCI_ACC_INT;
  else if(type==C_LONG)optype= ARMCI_ACC_LNG;
  else pnga_error("type not supported",type);

  gai_iterator_init(g_a, lo, hi, &it_hdl);

#ifndef NO_GA_STATS
  gam_CountElems(ndim, lo, hi, &elems);
  GAbytes.acctot += (double)size*elems;
  GAstat.numacc++;
  GAstat.numacc_procs += np;
#endif

  if(nbhandle)ga_init_nbhandle(nbhandle);
  else ga_init_nbhandle(&ga_nbhandle);

#ifdef PROFILE_OLD
  ga_profile_start((int)handle, (long)size*elems, ndim, lo, hi,
      ENABLE_PROFILE_ACC);
#endif

  for(loop=0; loop<num_loops; loop++) {
    Integer ldrem[MAXDIM];
    int stride_rem[MAXDIM], stride_loc[MAXDIM], count[MAXDIM];
    Integer idx_buf, *plo, *phi;
    char *pbuf, *prem;
    gai_iterator_reset(&it_hdl);

    while (gai_iterator_next(&it_hdl, &proc, &plo, &phi, &prem, ldrem)) {

      /* check if it is local to SMP */
      cond = armci_domain_same_id(ARMCI_DOMAIN_SMP,(int)proc);
      if(loop==0) cond = !cond;

      if(cond) {

        /* find the right spot in the user buffer */
        gam_ComputePatchIndex(ndim,lo, plo, ld, &idx_buf);
        pbuf = size*idx_buf + (char*)buf;

        gam_ComputeCount(ndim, plo, phi, count);

        /* scale number of rows by element size */
        count[0] *= size;
        gam_setstride(ndim, size, ld, ldrem, stride_rem, stride_loc);

        if(GA_fence_set)fence_array[proc]=1;

#ifndef NO_GA_STATS
        if(proc == GAme){
          gam_CountElems(ndim, plo, phi, &elems);
          GAbytes.accloc += (double)size*elems;
        }
#endif

        if(nbhandle) {
          ARMCI_NbAccS(optype, alpha, pbuf, stride_loc, prem,
              stride_rem, count, ndim-1, proc,
              (armci_hdl_t*)get_armci_nbhandle(nbhandle));
        } else {
#  if !defined(DISABLE_NBOPT)
          if((loop==0 && gai_iterator_last(&it_hdl)) || loop==1) {
            ARMCI_AccS(optype, alpha, pbuf, stride_loc, prem, stride_rem, 
                count, ndim-1, proc);
          } else {
            ARMCI_NbAccS(optype, alpha, pbuf, stride_loc, prem, 
                stride_rem, count, ndim-1, proc,
                (armci_hdl_t*)get_armci_nbhandle(&ga_nbhandle));
          }
#  else
          ARMCI_AccS(optype, alpha, pbuf, stride_loc, prem, stride_rem,
              count, ndim-1, proc);
#  endif
        }
      } /* end if(cond) */
    }
  }
#if !defined(DISABLE_NBOPT)
  if(!nbhandle) nga_wait_internal(&ga_nbhandle);
#endif

#ifdef PROFILE_OLD
  ga_profile_stop();
#endif
  GA_Internal_Threadsafe_Unlock();

  gai_iterator_destroy(&it_hdl);
}